

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O2

void __thiscall Rectangle::Rectangle(Rectangle *this,Vector *l,Vector *s1,Vector *s2)

{
  Vector *u;
  Vector *v;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 local_48 [16];
  double local_38;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_0010ab40
  ;
  u = &this->side1;
  v = &this->side2;
  dVar12 = l->y;
  (this->loc).x = l->x;
  (this->loc).y = dVar12;
  (this->loc).z = l->z;
  dVar12 = s1->y;
  (this->side1).x = s1->x;
  (this->side1).y = dVar12;
  (this->side1).z = s1->z;
  dVar12 = s2->y;
  (this->side2).x = s2->x;
  (this->side2).y = dVar12;
  (this->side2).z = s2->z;
  operator^(u,v);
  dVar12 = SQRT(local_38 * local_38 +
                local_48._0_8_ * local_48._0_8_ + local_48._8_8_ * local_48._8_8_);
  auVar10._8_8_ = dVar12;
  auVar10._0_8_ = dVar12;
  auVar10 = divpd(local_48,auVar10);
  (this->n).x = (double)auVar10._0_8_;
  (this->n).y = (double)auVar10._8_8_;
  (this->n).z = local_38 / dVar12;
  dVar5 = operator&(u,u);
  dVar6 = operator&(u,v);
  dVar7 = operator&(v,v);
  auVar11._0_8_ = dVar5 * dVar7 - dVar7 * dVar6;
  dVar12 = (this->side1).x;
  dVar1 = (this->side1).y;
  dVar2 = (this->side1).z;
  dVar3 = (this->side1).z;
  dVar4 = (this->side2).x;
  auVar13._0_8_ = dVar7 * dVar12 - (this->side2).x * dVar6;
  auVar13._8_8_ = dVar7 * (this->side1).y - (this->side2).y * dVar6;
  auVar11._8_8_ = auVar11._0_8_;
  auVar10 = divpd(auVar13,auVar11);
  (this->ku).x = (double)auVar10._0_8_;
  (this->ku).y = (double)auVar10._8_8_;
  auVar8._0_8_ = dVar7 * dVar3 - (this->side2).z * dVar6;
  auVar8._8_8_ = dVar5 * dVar4 - dVar12 * dVar6;
  auVar10 = divpd(auVar8,auVar11);
  *(undefined1 (*) [16])&(this->ku).z = auVar10;
  auVar9._0_8_ = (this->side2).y * dVar5 - dVar6 * dVar1;
  auVar9._8_8_ = (this->side2).z * dVar5 - dVar6 * dVar2;
  auVar10 = divpd(auVar9,auVar11);
  (this->kv).y = (double)auVar10._0_8_;
  (this->kv).z = (double)auVar10._8_8_;
  dVar12 = operator&(&this->loc,&this->ku);
  this->u0 = -dVar12;
  dVar12 = operator&(&this->loc,&this->kv);
  this->v0 = -dVar12;
  return;
}

Assistant:

Rectangle::Rectangle( const Vector& l, const Vector& s1, const Vector& s2  )
{
   loc   = l;
   side1 =  s1;
   side2 =  s2;
   n =   normalize( side1 ^ side2 );

   double s11 = side1 & side1;
   double s12 = side1 & side2;
   double s22 = side2 & side2;
   double d = s11 * s22 - s12 * s22; // determinant

   ku = (side1 * s22 -  side2 *  s12) / d;
   kv = (side2 * s11 -  side1 *  s12) / d;
   u0 = -(loc & ku);
   v0 = -(loc & kv);
}